

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

void * __thiscall
llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
          (BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *this,size_t Size,
          size_t Alignment)

{
  char *AlignedPtr;
  uintptr_t AlignedAddr;
  char *AlignedPtr_2;
  uintptr_t AlignedAddr_1;
  void *local_50;
  void *NewSlab;
  size_t PaddedSize;
  char *AlignedPtr_1;
  size_t SizeToAllocate;
  size_t Adjustment;
  size_t Alignment_local;
  size_t Size_local;
  BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *this_local;
  
  Adjustment = Alignment;
  Alignment_local = Size;
  Size_local = (size_t)this;
  if (Alignment == 0) {
    __assert_fail("Alignment > 0 && \"0-byte alignnment is not allowed. Use 1 instead.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/Allocator.h"
                  ,0xd8,
                  "void *llvm::BumpPtrAllocatorImpl<>::Allocate(size_t, size_t) [AllocatorT = llvm::MallocAllocator, SlabSize = 4096, SizeThreshold = 4096]"
                 );
  }
  this->BytesAllocated = Size + this->BytesAllocated;
  SizeToAllocate = alignmentAdjustment(this->CurPtr,Alignment);
  if (Alignment_local <= SizeToAllocate + Alignment_local) {
    AlignedPtr_1 = (char *)Alignment_local;
    if ((ulong)((long)this->End - (long)this->CurPtr) < SizeToAllocate + Alignment_local) {
      NewSlab = (void *)((Alignment_local + Adjustment) - 1);
      if (NewSlab < (void *)0x1001) {
        StartNewSlab(this);
        this_local = (BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *)
                     alignAddr(this->CurPtr,Adjustment);
        if (this->End < AlignedPtr_1 + (long)(&this_local->Slabs + -1) + 0x20) {
          __assert_fail("AlignedAddr + SizeToAllocate <= (uintptr_t)End && \"Unable to allocate memory!\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/Allocator.h"
                        ,0x108,
                        "void *llvm::BumpPtrAllocatorImpl<>::Allocate(size_t, size_t) [AllocatorT = llvm::MallocAllocator, SlabSize = 4096, SizeThreshold = 4096]"
                       );
        }
        this->CurPtr = AlignedPtr_1 + (long)(&this_local->Slabs + -1) + 0x20;
      }
      else {
        local_50 = MallocAllocator::Allocate((MallocAllocator *)&this->field_0x60,(size_t)NewSlab,0)
        ;
        _AlignedAddr_1 = std::make_pair<void*&,unsigned_long&>(&local_50,(unsigned_long *)&NewSlab);
        SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true>::push_back
                  ((SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true> *)
                   &this->CustomSizedSlabs,(pair<void_*,_unsigned_long> *)&AlignedAddr_1);
        this_local = (BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *)
                     alignAddr(local_50,Adjustment);
        if ((ulong)((long)local_50 + (long)NewSlab) <
            (long)(&(this_local->Slabs).super_SmallVectorStorage<void_*,_4U> + -1) + Alignment_local
           ) {
          __assert_fail("AlignedAddr + Size <= (uintptr_t)NewSlab + PaddedSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/Allocator.h"
                        ,0xfd,
                        "void *llvm::BumpPtrAllocatorImpl<>::Allocate(size_t, size_t) [AllocatorT = llvm::MallocAllocator, SlabSize = 4096, SizeThreshold = 4096]"
                       );
        }
      }
    }
    else {
      this_local = (BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *)
                   (this->CurPtr + SizeToAllocate);
      this->CurPtr = (char *)((long)(&(this_local->Slabs).super_SmallVectorStorage<void_*,_4U> + -1)
                             + Alignment_local);
    }
    return this_local;
  }
  __assert_fail("Adjustment + Size >= Size && \"Adjustment + Size must not overflow\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/Allocator.h"
                ,0xde,
                "void *llvm::BumpPtrAllocatorImpl<>::Allocate(size_t, size_t) [AllocatorT = llvm::MallocAllocator, SlabSize = 4096, SizeThreshold = 4096]"
               );
}

Assistant:

void *
  Allocate(size_t Size, size_t Alignment) {
    assert(Alignment > 0 && "0-byte alignnment is not allowed. Use 1 instead.");

    // Keep track of how many bytes we've allocated.
    BytesAllocated += Size;

    size_t Adjustment = alignmentAdjustment(CurPtr, Alignment);
    assert(Adjustment + Size >= Size && "Adjustment + Size must not overflow");

    size_t SizeToAllocate = Size;
#if LLVM_ADDRESS_SANITIZER_BUILD
    // Add trailing bytes as a "red zone" under ASan.
    SizeToAllocate += RedZoneSize;
#endif

    // Check if we have enough space.
    if (Adjustment + SizeToAllocate <= size_t(End - CurPtr)) {
      char *AlignedPtr = CurPtr + Adjustment;
      CurPtr = AlignedPtr + SizeToAllocate;
      // Update the allocation point of this memory block in MemorySanitizer.
      // Without this, MemorySanitizer messages for values originated from here
      // will point to the allocation of the entire slab.
      __msan_allocated_memory(AlignedPtr, Size);
      // Similarly, tell ASan about this space.
      __asan_unpoison_memory_region(AlignedPtr, Size);
      return AlignedPtr;
    }

    // If Size is really big, allocate a separate slab for it.
    size_t PaddedSize = SizeToAllocate + Alignment - 1;
    if (PaddedSize > SizeThreshold) {
      void *NewSlab = Allocator.Allocate(PaddedSize, 0);
      // We own the new slab and don't want anyone reading anyting other than
      // pieces returned from this method.  So poison the whole slab.
      __asan_poison_memory_region(NewSlab, PaddedSize);
      CustomSizedSlabs.push_back(std::make_pair(NewSlab, PaddedSize));

      uintptr_t AlignedAddr = alignAddr(NewSlab, Alignment);
      assert(AlignedAddr + Size <= (uintptr_t)NewSlab + PaddedSize);
      char *AlignedPtr = (char*)AlignedAddr;
      __msan_allocated_memory(AlignedPtr, Size);
      __asan_unpoison_memory_region(AlignedPtr, Size);
      return AlignedPtr;
    }

    // Otherwise, start a new slab and try again.
    StartNewSlab();
    uintptr_t AlignedAddr = alignAddr(CurPtr, Alignment);
    assert(AlignedAddr + SizeToAllocate <= (uintptr_t)End &&
           "Unable to allocate memory!");
    char *AlignedPtr = (char*)AlignedAddr;
    CurPtr = AlignedPtr + SizeToAllocate;
    __msan_allocated_memory(AlignedPtr, Size);
    __asan_unpoison_memory_region(AlignedPtr, Size);
    return AlignedPtr;
  }